

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

U32 __thiscall
HdlcSimulationDataGenerator::GenerateSimulationData
          (HdlcSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  U8 UVar1;
  HdlcFrameType frameType_00;
  HdlcAddressType addressType;
  HdlcControlType controlType;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  U16 local_a4;
  undefined1 local_98 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> information;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> control;
  vector<unsigned_char,_std::allocator<unsigned_char>_> address;
  U64 addressBytes;
  U32 sizeOfInformation;
  HdlcFrameType frameType;
  U64 adjusted_largest_sample_requested;
  SimulationChannelDescriptor **simulation_channel_local;
  U32 sample_rate_local;
  U64 largest_sample_requested_local;
  HdlcSimulationDataGenerator *this_local;
  
  uVar5 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while( true ) {
    uVar6 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar5 <= uVar6) break;
    CreateFlag(this);
    CreateFlag(this);
    frameType_00 = this->mFrameTypes[(ulong)this->mFrameNumber % 3];
    if (frameType_00 == HDLC_S_FRAME) {
      local_a4 = 0;
    }
    else {
      iVar2 = rand();
      local_a4 = (short)(iVar2 % 4) + 1;
    }
    uVar3 = rand();
    uVar4 = uVar3;
    if ((int)uVar3 < 0) {
      uVar4 = uVar3 + 3;
    }
    addressType = this->mSettings->mHdlcAddr;
    UVar1 = this->mAddresByteValue;
    this->mAddresByteValue = UVar1 + '\x01';
    GenAddressField((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    &control.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,this,addressType,
                    (long)(int)((uVar3 + 1) - (uVar4 & 0xfffffffc)),UVar1);
    controlType = this->mSettings->mHdlcControl;
    UVar1 = this->mControlValue;
    this->mControlValue = UVar1 + '\x01';
    GenControlField((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,this,
                    frameType_00,controlType,UVar1);
    UVar1 = this->mInformationByteValue;
    this->mInformationByteValue = UVar1 + '\x01';
    GenInformationField((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,this,
                        local_a4,UVar1);
    CreateHDLCFrame(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &control.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
    CreateFlag(this);
    CreateFlag(this);
    this->mFrameNumber = this->mFrameNumber + 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &control.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  *simulation_channel = &this->mHdlcSimulationData;
  return 1;
}

Assistant:

U32 HdlcSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                         SimulationChannelDescriptor** simulation_channel )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mHdlcSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        // Two consecutive flags
        CreateFlag();
        CreateFlag();

        HdlcFrameType frameType = mFrameTypes[ mFrameNumber % 3 ];
        U32 sizeOfInformation = ( frameType == HDLC_S_FRAME ) ? 0 : ( ( rand() % 4 ) + 1 );
        U64 addressBytes = ( ( rand() % 4 ) + 1 );

        vector<U8> address = GenAddressField( mSettings->mHdlcAddr, addressBytes, mAddresByteValue++ );
        vector<U8> control = GenControlField( frameType, mSettings->mHdlcControl, mControlValue++ );
        vector<U8> information = GenInformationField( sizeOfInformation, mInformationByteValue++ );

        CreateHDLCFrame( address, control, information );

        // Two consecutive flags
        CreateFlag();
        CreateFlag();

        mFrameNumber++;
    }

    *simulation_channel = &mHdlcSimulationData;
    return 1;
}